

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O3

void __thiscall
icu_63::OlsonTimeZone::OlsonTimeZone
          (OlsonTimeZone *this,UResourceBundle *top,UResourceBundle *res,UnicodeString *tzid,
          UErrorCode *ec)

{
  UErrorCode UVar1;
  int32_t iVar2;
  int32_t *piVar3;
  uint8_t *puVar4;
  UChar *pUVar5;
  UResourceBundle *resB;
  int32_t *piVar6;
  SimpleTimeZone *this_00;
  int rawOffsetGMT;
  double dVar7;
  int32_t len;
  ulong local_1c0;
  SimpleTimeZone *local_1b8;
  ConstChar16Ptr local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  ulong local_198;
  ulong local_190;
  UChar *local_188;
  UResourceBundle r;
  UnicodeString emptyStr;
  UnicodeString ruleID;
  
  BasicTimeZone::BasicTimeZone(&this->super_BasicTimeZone,tzid);
  (this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject =
       (_func_int **)&PTR__OlsonTimeZone_003a3700;
  this->finalZone = (SimpleTimeZone *)0x0;
  this->finalZoneWithStartYear = (SimpleTimeZone *)0x0;
  this->initialRule = (InitialTimeZoneRule *)0x0;
  this->firstTZTransition = (TimeZoneTransition *)0x0;
  this->firstTZTransitionIdx = 0;
  this->firstFinalTZTransition = (TimeZoneTransition *)0x0;
  this->historicRules = (TimeArrayTimeZoneRule **)0x0;
  this->historicRuleCount = 0;
  LOCK();
  (this->transitionRulesInitOnce).fState.super___atomic_base<int>._M_i = 0;
  UNLOCK();
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR &&
      (res == (UResourceBundle *)0x0 || top == (UResourceBundle *)0x0)) {
    *ec = U_ILLEGAL_ARGUMENT_ERROR;
    goto LAB_001ea01c;
  }
  if (U_ZERO_ERROR < *ec) goto LAB_001ea01c;
  ures_initStackObject_63(&r);
  ures_getByKey_63(res,"transPre32",&r,ec);
  piVar3 = ures_getIntVector_63(&r,&len,ec);
  this->transitionTimesPre32 = piVar3;
  this->transitionCountPre32 = (int16_t)((uint)len >> 1);
  if (*ec == U_MISSING_RESOURCE_ERROR) {
    this->transitionTimesPre32 = (int32_t *)0x0;
    this->transitionCountPre32 = 0;
    UVar1 = U_ZERO_ERROR;
LAB_001ea07d:
    *ec = UVar1;
  }
  else {
    UVar1 = U_INVALID_FORMAT_ERROR;
    if ((len & 0xffff8001U) != 0 && *ec < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_001ea07d;
  }
  ures_getByKey_63(res,"trans",&r,ec);
  piVar3 = ures_getIntVector_63(&r,&len,ec);
  this->transitionTimes32 = piVar3;
  this->transitionCount32 = (int16_t)len;
  if (*ec == U_MISSING_RESOURCE_ERROR) {
    this->transitionTimes32 = (int32_t *)0x0;
    this->transitionCount32 = 0;
    UVar1 = U_ZERO_ERROR;
LAB_001ea0e8:
    *ec = UVar1;
  }
  else {
    UVar1 = U_INVALID_FORMAT_ERROR;
    if (0x7fff < (uint)len && *ec < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_001ea0e8;
  }
  ures_getByKey_63(res,"transPost32",&r,ec);
  piVar3 = ures_getIntVector_63(&r,&len,ec);
  this->transitionTimesPost32 = piVar3;
  this->transitionCountPost32 = (int16_t)((uint)len >> 1);
  if (*ec == U_MISSING_RESOURCE_ERROR) {
    this->transitionTimesPost32 = (int32_t *)0x0;
    this->transitionCountPost32 = 0;
    UVar1 = U_ZERO_ERROR;
LAB_001ea154:
    *ec = UVar1;
  }
  else {
    UVar1 = U_INVALID_FORMAT_ERROR;
    if ((len & 0xffff8001U) != 0 && *ec < U_ILLEGAL_ARGUMENT_ERROR) goto LAB_001ea154;
  }
  ures_getByKey_63(res,"typeOffsets",&r,ec);
  piVar3 = ures_getIntVector_63(&r,&len,ec);
  this->typeOffsets = piVar3;
  if ((*ec < U_ILLEGAL_ARGUMENT_ERROR) && (0x7ffc < len - 2U || (len & 1U) != 0)) {
    *ec = U_INVALID_FORMAT_ERROR;
  }
  this->typeCount = (int16_t)((uint)(int)(short)len >> 1);
  this->typeMapData = (uint8_t *)0x0;
  if (0 < (short)(this->transitionCount32 + this->transitionCountPre32 + this->transitionCountPost32
                 )) {
    ures_getByKey_63(res,"typeMap",&r,ec);
    puVar4 = ures_getBinary_63(&r,&len,ec);
    this->typeMapData = puVar4;
    if ((*ec == U_MISSING_RESOURCE_ERROR) ||
       ((*ec < U_ILLEGAL_ARGUMENT_ERROR &&
        (len != (short)(this->transitionCount32 + this->transitionCountPre32 +
                       this->transitionCountPost32))))) {
      *ec = U_INVALID_FORMAT_ERROR;
    }
  }
  pUVar5 = ures_getStringByKey_63(res,"finalRule",&len,ec);
  ures_getByKey_63(res,"finalRaw",&r,ec);
  iVar2 = ures_getInt_63(&r,ec);
  local_1c0 = CONCAT44(local_1c0._4_4_,iVar2);
  ures_getByKey_63(res,"finalYear",&r,ec);
  iVar2 = ures_getInt_63(&r,ec);
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    local_1b0.p_ = pUVar5;
    UnicodeString::UnicodeString(&ruleID,'\x01',&local_1b0,len);
    local_188 = local_1b0.p_;
    resB = TimeZone::loadRule(top,&ruleID,(UResourceBundle *)0x0,ec);
    piVar3 = &len;
    piVar6 = ures_getIntVector_63(resB,piVar3,ec);
    if ((*ec < U_ILLEGAL_ARGUMENT_ERROR) && (len == 0xb)) {
      emptyStr.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258
      ;
      emptyStr.fUnion.fStackFields.fLengthAndFlags = 2;
      this_00 = (SimpleTimeZone *)UMemory::operator_new((UMemory *)0xa0,(size_t)piVar3);
      if (this_00 == (SimpleTimeZone *)0x0) {
        this->finalZone = (SimpleTimeZone *)0x0;
        *ec = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        rawOffsetGMT = (int)local_1c0 * 1000;
        local_1c0 = (ulong)(uint)(piVar6[3] * 1000);
        local_190 = (ulong)(uint)(int)(char)piVar6[5];
        local_1a0 = (ulong)(uint)(int)(char)piVar6[6];
        local_1a8 = (ulong)(uint)(int)(char)piVar6[7];
        local_198 = (ulong)(uint)piVar6[4];
        local_1b8 = this_00;
        SimpleTimeZone::SimpleTimeZone
                  (this_00,rawOffsetGMT,&emptyStr,(int8_t)*piVar6,(int8_t)piVar6[1],
                   (int8_t)piVar6[2],piVar6[3] * 1000,piVar6[4],(char)piVar6[5],(char)piVar6[6],
                   (char)piVar6[7],piVar6[8] * 1000,piVar6[9],piVar6[10] * 1000,ec);
        this->finalZone = local_1b8;
        this->finalStartYear = iVar2;
        dVar7 = Grego::fieldsToDay(iVar2,0,1);
        this->finalStartMillis = dVar7 * 86400000.0;
      }
      UnicodeString::~UnicodeString(&emptyStr);
    }
    else {
      *ec = U_INVALID_FORMAT_ERROR;
    }
    ures_close_63(resB);
    UnicodeString::~UnicodeString(&ruleID);
  }
  else if (*ec == U_MISSING_RESOURCE_ERROR) {
    *ec = U_ZERO_ERROR;
  }
  ures_close_63(&r);
  pUVar5 = ZoneMeta::getCanonicalCLDRID(tzid,ec);
  this->canonicalID = pUVar5;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    return;
  }
LAB_001ea01c:
  this->canonicalID = (UChar *)0x0;
  this->transitionCountPost32 = 0;
  this->transitionCountPre32 = 0;
  this->transitionCount32 = 0;
  this->typeMapData = (uint8_t *)0x0;
  this->finalZone = (SimpleTimeZone *)0x0;
  this->transitionTimesPre32 = (int32_t *)0x0;
  this->transitionTimes32 = (int32_t *)0x0;
  this->transitionTimesPost32 = (int32_t *)0x0;
  this->typeCount = 1;
  this->typeOffsets = (int32_t *)&ZEROS;
  return;
}

Assistant:

OlsonTimeZone::OlsonTimeZone(const UResourceBundle* top,
                             const UResourceBundle* res,
                             const UnicodeString& tzid,
                             UErrorCode& ec) :
  BasicTimeZone(tzid), finalZone(NULL)
{
    clearTransitionRules();
    U_DEBUG_TZ_MSG(("OlsonTimeZone(%s)\n", ures_getKey((UResourceBundle*)res)));
    if ((top == NULL || res == NULL) && U_SUCCESS(ec)) {
        ec = U_ILLEGAL_ARGUMENT_ERROR;
    }
    if (U_SUCCESS(ec)) {
        // TODO -- clean up -- Doesn't work if res points to an alias
        //        // TODO remove nonconst casts below when ures_* API is fixed
        //        setID(ures_getKey((UResourceBundle*) res)); // cast away const

        int32_t len;
        UResourceBundle r;
        ures_initStackObject(&r);

        // Pre-32bit second transitions
        ures_getByKey(res, kTRANSPRE32, &r, &ec);
        transitionTimesPre32 = ures_getIntVector(&r, &len, &ec);
        transitionCountPre32 = static_cast<int16_t>(len >> 1);
        if (ec == U_MISSING_RESOURCE_ERROR) {
            // No pre-32bit transitions
            transitionTimesPre32 = NULL;
            transitionCountPre32 = 0;
            ec = U_ZERO_ERROR;
        } else if (U_SUCCESS(ec) && (len < 0 || len > 0x7FFF || (len & 1) != 0) /* len must be even */) {
            ec = U_INVALID_FORMAT_ERROR;
        }

        // 32bit second transitions
        ures_getByKey(res, kTRANS, &r, &ec);
        transitionTimes32 = ures_getIntVector(&r, &len, &ec);
        transitionCount32 = static_cast<int16_t>(len);
        if (ec == U_MISSING_RESOURCE_ERROR) {
            // No 32bit transitions
            transitionTimes32 = NULL;
            transitionCount32 = 0;
            ec = U_ZERO_ERROR;
        } else if (U_SUCCESS(ec) && (len < 0 || len > 0x7FFF)) {
            ec = U_INVALID_FORMAT_ERROR;
        }

        // Post-32bit second transitions
        ures_getByKey(res, kTRANSPOST32, &r, &ec);
        transitionTimesPost32 = ures_getIntVector(&r, &len, &ec);
        transitionCountPost32 = static_cast<int16_t>(len >> 1);
        if (ec == U_MISSING_RESOURCE_ERROR) {
            // No pre-32bit transitions
            transitionTimesPost32 = NULL;
            transitionCountPost32 = 0;
            ec = U_ZERO_ERROR;
        } else if (U_SUCCESS(ec) && (len < 0 || len > 0x7FFF || (len & 1) != 0) /* len must be even */) {
            ec = U_INVALID_FORMAT_ERROR;
        }

        // Type offsets list must be of even size, with size >= 2
        ures_getByKey(res, kTYPEOFFSETS, &r, &ec);
        typeOffsets = ures_getIntVector(&r, &len, &ec);
        if (U_SUCCESS(ec) && (len < 2 || len > 0x7FFE || (len & 1) != 0)) {
            ec = U_INVALID_FORMAT_ERROR;
        }
        typeCount = (int16_t) len >> 1;

        // Type map data must be of the same size as the transition count
        typeMapData =  NULL;
        if (transitionCount() > 0) {
            ures_getByKey(res, kTYPEMAP, &r, &ec);
            typeMapData = ures_getBinary(&r, &len, &ec);
            if (ec == U_MISSING_RESOURCE_ERROR) {
                // no type mapping data
                ec = U_INVALID_FORMAT_ERROR;
            } else if (U_SUCCESS(ec) && len != transitionCount()) {
                ec = U_INVALID_FORMAT_ERROR;
            }
        }

        // Process final rule and data, if any
        const UChar *ruleIdUStr = ures_getStringByKey(res, kFINALRULE, &len, &ec);
        ures_getByKey(res, kFINALRAW, &r, &ec);
        int32_t ruleRaw = ures_getInt(&r, &ec);
        ures_getByKey(res, kFINALYEAR, &r, &ec);
        int32_t ruleYear = ures_getInt(&r, &ec);
        if (U_SUCCESS(ec)) {
            UnicodeString ruleID(TRUE, ruleIdUStr, len);
            UResourceBundle *rule = TimeZone::loadRule(top, ruleID, NULL, ec);
            const int32_t *ruleData = ures_getIntVector(rule, &len, &ec); 
            if (U_SUCCESS(ec) && len == 11) {
                UnicodeString emptyStr;
                finalZone = new SimpleTimeZone(
                    ruleRaw * U_MILLIS_PER_SECOND,
                    emptyStr,
                    (int8_t)ruleData[0], (int8_t)ruleData[1], (int8_t)ruleData[2],
                    ruleData[3] * U_MILLIS_PER_SECOND,
                    (SimpleTimeZone::TimeMode) ruleData[4],
                    (int8_t)ruleData[5], (int8_t)ruleData[6], (int8_t)ruleData[7],
                    ruleData[8] * U_MILLIS_PER_SECOND,
                    (SimpleTimeZone::TimeMode) ruleData[9],
                    ruleData[10] * U_MILLIS_PER_SECOND, ec);
                if (finalZone == NULL) {
                    ec = U_MEMORY_ALLOCATION_ERROR;
                } else {
                    finalStartYear = ruleYear;

                    // Note: Setting finalStartYear to the finalZone is problematic.  When a date is around
                    // year boundary, SimpleTimeZone may return false result when DST is observed at the 
                    // beginning of year.  We could apply safe margin (day or two), but when one of recurrent
                    // rules falls around year boundary, it could return false result.  Without setting the
                    // start year, finalZone works fine around the year boundary of the start year.

                    // finalZone->setStartYear(finalStartYear);


                    // Compute the millis for Jan 1, 0:00 GMT of the finalYear

                    // Note: finalStartMillis is used for detecting either if
                    // historic transition data or finalZone to be used.  In an
                    // extreme edge case - for example, two transitions fall into
                    // small windows of time around the year boundary, this may
                    // result incorrect offset computation.  But I think it will
                    // never happen practically.  Yoshito - Feb 20, 2010
                    finalStartMillis = Grego::fieldsToDay(finalStartYear, 0, 1) * U_MILLIS_PER_DAY;
                }
            } else {
                ec = U_INVALID_FORMAT_ERROR;
            }
            ures_close(rule);
        } else if (ec == U_MISSING_RESOURCE_ERROR) {
            // No final zone
            ec = U_ZERO_ERROR;
        }
        ures_close(&r);

        // initialize canonical ID
        canonicalID = ZoneMeta::getCanonicalCLDRID(tzid, ec);
    }

    if (U_FAILURE(ec)) {
        constructEmpty();
    }
}